

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperRefs.c
# Opt level: O2

void Map_MappingSetRefs(Map_Man_t *pMan)

{
  Map_NodeVec_t *pMVar1;
  Map_Node_t *pMVar2;
  int iVar3;
  long lVar4;
  
  if (pMan->fUseProfile != 0) {
    Mio_LibraryCleanProfile2(pMan->pSuperLib->pGenlib);
  }
  pMVar1 = pMan->vMapObjs;
  for (lVar4 = 0; lVar4 < pMVar1->nSize; lVar4 = lVar4 + 1) {
    pMVar2 = pMVar1->pArray[lVar4];
    pMVar2->nRefAct[0] = 0;
    pMVar2->nRefAct[1] = 0;
    pMVar2->nRefAct[2] = 0;
  }
  for (lVar4 = 0; lVar4 < pMan->nOutputs; lVar4 = lVar4 + 1) {
    pMVar2 = pMan->pOutputs[lVar4];
    iVar3 = Map_NodeIsConst(pMVar2);
    if (iVar3 == 0) {
      Map_MappingSetRefs_rec(pMan,pMVar2);
    }
  }
  return;
}

Assistant:

void Map_MappingSetRefs( Map_Man_t * pMan )
{
    Map_Node_t * pNode;
    int i;
    if ( pMan->fUseProfile )
        Mio_LibraryCleanProfile2( pMan->pSuperLib->pGenlib );
    // clean all references
    for ( i = 0; i < pMan->vMapObjs->nSize; i++ )
    {
        pNode = pMan->vMapObjs->pArray[i];
        pNode->nRefAct[0] = 0;
        pNode->nRefAct[1] = 0;
        pNode->nRefAct[2] = 0;
    }
    // visit nodes reachable from POs in the DFS order through the best cuts
    for ( i = 0; i < pMan->nOutputs; i++ )
    {
        pNode = pMan->pOutputs[i];
        if ( !Map_NodeIsConst(pNode) )
            Map_MappingSetRefs_rec( pMan, pNode );
    }
}